

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

void __thiscall
pbrt::PiecewiseConstant1D::PiecewiseConstant1D
          (PiecewiseConstant1D *this,span<const_float> f,Float min,Float max,Allocator alloc)

{
  float **ppfVar1;
  float fVar2;
  float *pfVar3;
  float *pfVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  byte bVar21;
  size_t sVar22;
  size_t sVar23;
  ulong uVar24;
  ushort uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar38 [16];
  undefined1 in_ZMM4 [64];
  Float vb;
  Float local_40;
  Float local_3c;
  Float va;
  undefined4 uStack_34;
  
  auVar37 = in_ZMM2._0_16_;
  auVar38 = in_ZMM4._0_16_;
  sVar22 = f.n;
  local_40 = min;
  local_3c = max;
  _va = alloc.memoryResource;
  pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>::vector<float_const*>
            ((vector<float,pstd::pmr::polymorphic_allocator<float>> *)this,f.ptr,f.ptr + sVar22,
             (polymorphic_allocator<float> *)&va);
  uVar24 = sVar22 + 1;
  (this->cdf).alloc.memoryResource = alloc.memoryResource;
  (this->cdf).ptr = (float *)0x0;
  (this->cdf).nAlloc = 0;
  (this->cdf).nStored = 0;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve(&this->cdf,uVar24);
  ppfVar1 = &(this->cdf).ptr;
  if (uVar24 != 0) {
    memset(*ppfVar1,0,uVar24 * 4);
  }
  (this->cdf).nStored = uVar24;
  this->min = local_40;
  this->max = local_3c;
  this->funcInt = 0.0;
  va = local_3c;
  vb = local_40;
  if (local_3c <= local_40) {
    LogFatal<char_const(&)[4],char_const(&)[4],char_const(&)[4],float&,char_const(&)[4],float&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.h"
               ,0x2bd,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [4])0x4c425c,
               (char (*) [4])0x4c424e,(char (*) [4])0x4c425c,(float *)&va,(char (*) [4])0x4c424e,&vb
              );
  }
  pfVar3 = *ppfVar1;
  *pfVar3 = 0.0;
  if (1 < uVar24) {
    pfVar4 = (this->func).ptr;
    auVar37 = vcvtusi2ss_avx512f(auVar37,sVar22);
    sVar23 = 0;
    do {
      va = pfVar4[sVar23];
      vb = 0.0;
      if (va < 0.0) {
        LogFatal<char_const(&)[12],char_const(&)[2],char_const(&)[12],float&,char_const(&)[2],int&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.h"
                   ,0x2c2,"Check failed: %s >= %s with %s = %s, %s = %s",
                   (char (*) [12])"func[i - 1]",(char (*) [2])0x28e1834,(char (*) [12])"func[i - 1]"
                   ,(float *)&va,(char (*) [2])0x28e1834,(int *)&vb);
      }
      pfVar3[sVar23 + 1] = ((local_3c - local_40) * pfVar4[sVar23]) / auVar37._0_4_ + pfVar3[sVar23]
      ;
      sVar23 = sVar23 + 1;
    } while (sVar22 != sVar23);
  }
  fVar2 = pfVar3[sVar22];
  this->funcInt = fVar2;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    if (1 < uVar24) {
      sVar23 = 0;
      do {
        pfVar3[sVar23 + 1] = pfVar3[sVar23 + 1] / this->funcInt;
        sVar23 = sVar23 + 1;
      } while (sVar22 != sVar23);
    }
  }
  else if (1 < uVar24) {
    auVar37 = vcvtusi2ss_avx512f(auVar38,sVar22);
    auVar28 = vpbroadcastq_avx512f();
    auVar29 = vbroadcastss_avx512f(auVar37);
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x100f0e0d0c0b0a09));
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    uVar24 = 0;
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar34 = vpbroadcastq_avx512f(ZEXT816(0x10));
    do {
      auVar35 = vpbroadcastq_avx512f();
      auVar36 = vporq_avx512f(auVar35,auVar32);
      auVar35 = vporq_avx512f(auVar35,auVar33);
      uVar19 = vpcmpuq_avx512f(auVar35,auVar28,2);
      uVar20 = vpcmpuq_avx512f(auVar36,auVar28,2);
      bVar21 = (byte)uVar20;
      uVar25 = CONCAT11(bVar21,(byte)uVar19);
      auVar26 = vcvtuqq2ps_avx512dq(auVar31);
      auVar27 = vcvtuqq2ps_avx512dq(auVar30);
      auVar35 = vinsertf64x4_avx512f(ZEXT3264(auVar26),auVar27,1);
      auVar35 = vdivps_avx512f(auVar35,auVar29);
      pfVar4 = pfVar3 + uVar24 + 1;
      bVar5 = (bool)((byte)uVar19 & 1);
      bVar6 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar8 = (bool)((byte)(uVar25 >> 3) & 1);
      bVar9 = (bool)((byte)(uVar25 >> 4) & 1);
      bVar10 = (bool)((byte)(uVar25 >> 5) & 1);
      bVar11 = (bool)((byte)(uVar25 >> 6) & 1);
      bVar12 = (bool)((byte)(uVar25 >> 7) & 1);
      bVar13 = (bool)(bVar21 >> 1 & 1);
      bVar14 = (bool)(bVar21 >> 2 & 1);
      bVar15 = (bool)(bVar21 >> 3 & 1);
      bVar16 = (bool)(bVar21 >> 4 & 1);
      bVar17 = (bool)(bVar21 >> 5 & 1);
      bVar18 = (bool)(bVar21 >> 6 & 1);
      *pfVar4 = (float)((uint)bVar5 * auVar35._0_4_ | (uint)!bVar5 * (int)*pfVar4);
      pfVar4[1] = (float)((uint)bVar6 * auVar35._4_4_ | (uint)!bVar6 * (int)pfVar4[1]);
      pfVar4[2] = (float)((uint)bVar7 * auVar35._8_4_ | (uint)!bVar7 * (int)pfVar4[2]);
      pfVar4[3] = (float)((uint)bVar8 * auVar35._12_4_ | (uint)!bVar8 * (int)pfVar4[3]);
      pfVar4[4] = (float)((uint)bVar9 * auVar35._16_4_ | (uint)!bVar9 * (int)pfVar4[4]);
      pfVar4[5] = (float)((uint)bVar10 * auVar35._20_4_ | (uint)!bVar10 * (int)pfVar4[5]);
      pfVar4[6] = (float)((uint)bVar11 * auVar35._24_4_ | (uint)!bVar11 * (int)pfVar4[6]);
      pfVar4[7] = (float)((uint)bVar12 * auVar35._28_4_ | (uint)!bVar12 * (int)pfVar4[7]);
      pfVar4[8] = (float)((uint)(bVar21 & 1) * auVar35._32_4_ |
                         (uint)!(bool)(bVar21 & 1) * (int)pfVar4[8]);
      pfVar4[9] = (float)((uint)bVar13 * auVar35._36_4_ | (uint)!bVar13 * (int)pfVar4[9]);
      pfVar4[10] = (float)((uint)bVar14 * auVar35._40_4_ | (uint)!bVar14 * (int)pfVar4[10]);
      pfVar4[0xb] = (float)((uint)bVar15 * auVar35._44_4_ | (uint)!bVar15 * (int)pfVar4[0xb]);
      pfVar4[0xc] = (float)((uint)bVar16 * auVar35._48_4_ | (uint)!bVar16 * (int)pfVar4[0xc]);
      pfVar4[0xd] = (float)((uint)bVar17 * auVar35._52_4_ | (uint)!bVar17 * (int)pfVar4[0xd]);
      pfVar4[0xe] = (float)((uint)bVar18 * auVar35._56_4_ | (uint)!bVar18 * (int)pfVar4[0xe]);
      pfVar4[0xf] = (float)((uint)(bVar21 >> 7) * auVar35._60_4_ |
                           (uint)!(bool)(bVar21 >> 7) * (int)pfVar4[0xf]);
      uVar24 = uVar24 + 0x10;
      auVar31 = vpaddq_avx512f(auVar31,auVar34);
      auVar30 = vpaddq_avx512f(auVar30,auVar34);
    } while ((sVar22 + 0xf & 0xfffffffffffffff0) != uVar24);
  }
  return;
}

Assistant:

PiecewiseConstant1D(pstd::span<const Float> f, Float min, Float max,
                        Allocator alloc = {})
        : func(f.begin(), f.end(), alloc), cdf(f.size() + 1, alloc), min(min), max(max) {
        CHECK_GT(max, min);
        // Compute integral of step function at $x_i$
        cdf[0] = 0;
        size_t n = f.size();
        for (size_t i = 1; i < n + 1; ++i) {
            CHECK_GE(func[i - 1], 0);
            cdf[i] = cdf[i - 1] + func[i - 1] * (max - min) / n;
        }

        // Transform step function integral into CDF
        funcInt = cdf[n];
        if (funcInt == 0)
            for (size_t i = 1; i < n + 1; ++i)
                cdf[i] = Float(i) / Float(n);
        else
            for (size_t i = 1; i < n + 1; ++i)
                cdf[i] /= funcInt;
    }